

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O2

double get_decfun_bias(model *model_,int label_idx)

{
  double dVar1;
  double dVar2;
  
  dVar1 = model_->bias;
  dVar2 = 0.0;
  if (0.0 < dVar1) {
    dVar2 = get_w_value(model_,model_->nr_feature,label_idx);
    dVar2 = dVar1 * dVar2;
  }
  return dVar2;
}

Assistant:

double get_decfun_bias(const struct model *model_, int label_idx)
{
	int bias_idx = model_->nr_feature;
	double bias = model_->bias;
	if(bias <= 0)
		return 0;
	else
		return bias*get_w_value(model_, bias_idx, label_idx);
}